

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

Vector<int,_2> __thiscall tcu::Vector<int,_3>::toWidth<2>(Vector<int,_3> *this)

{
  long lVar1;
  Vector<int,_2> *res;
  int in_RDI [2];
  
  *(undefined8 *)in_RDI = 0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    *(int *)((long)in_RDI + lVar1 * 4) = this->m_data[lVar1];
  }
  return (Vector<int,_2>)in_RDI;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}